

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void unsetJoinExpr(Expr *p,int iTable,int nullable)

{
  byte *pbVar1;
  uint uVar2;
  ExprList *pEVar3;
  long lVar4;
  long lVar5;
  
  if (p != (Expr *)0x0) {
    do {
      if ((iTable < 0) || (((p->flags & 1) != 0 && ((p->w).iJoin == iTable)))) {
        uVar2 = p->flags & 0xfffffffc;
        p->flags = uVar2;
        if (-1 < iTable) {
          p->flags = uVar2 | 2;
        }
      }
      if (p->op == 0xac) {
        if (((p->x).pList != (ExprList *)0x0) && (pEVar3 = (p->x).pList, 0 < pEVar3->nExpr)) {
          lVar5 = 8;
          lVar4 = 0;
          do {
            unsetJoinExpr(*(Expr **)((long)pEVar3->a + lVar5 + -8),iTable,nullable);
            lVar4 = lVar4 + 1;
            pEVar3 = (p->x).pList;
            lVar5 = lVar5 + 0x18;
          } while (lVar4 < pEVar3->nExpr);
        }
      }
      else if (((p->op == 0xa8) && (nullable == 0)) && (p->iTable == iTable)) {
        pbVar1 = (byte *)((long)&p->flags + 2);
        *pbVar1 = *pbVar1 & 0xdf;
      }
      unsetJoinExpr(p->pLeft,iTable,nullable);
      p = p->pRight;
    } while (p != (Expr *)0x0);
  }
  return;
}

Assistant:

static void unsetJoinExpr(Expr *p, int iTable, int nullable){
  while( p ){
    if( iTable<0 || (ExprHasProperty(p, EP_OuterON) && p->w.iJoin==iTable) ){
      ExprClearProperty(p, EP_OuterON|EP_InnerON);
      if( iTable>=0 ) ExprSetProperty(p, EP_InnerON);
    }
    if( p->op==TK_COLUMN && p->iTable==iTable && !nullable ){
      ExprClearProperty(p, EP_CanBeNull);
    }
    if( p->op==TK_FUNCTION ){
      assert( ExprUseXList(p) );
      assert( p->pLeft==0 );
      if( p->x.pList ){
        int i;
        for(i=0; i<p->x.pList->nExpr; i++){
          unsetJoinExpr(p->x.pList->a[i].pExpr, iTable, nullable);
        }
      }
    }
    unsetJoinExpr(p->pLeft, iTable, nullable);
    p = p->pRight;
  }
}